

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O2

void __thiscall
duckdb::BinarySerializer::BinarySerializer
          (BinarySerializer *this,WriteStream *stream,SerializationOptions *options_p)

{
  Serializer::Serializer(&this->super_Serializer);
  (this->super_Serializer)._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_0278e5f8;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->stream = stream;
  SerializationData::SerializationData(&this->data);
  SerializationOptions::operator=(&(this->super_Serializer).options,options_p);
  (this->super_Serializer).options.serialize_enum_as_string = false;
  return;
}

Assistant:

explicit BinarySerializer(WriteStream &stream, SerializationOptions options_p = SerializationOptions())
	    : stream(stream) {
		options = std::move(options_p);
		// Override the value set by the passed in SerializationOptions
		options.serialize_enum_as_string = false;
	}